

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

BinOpr subexpr(LexState *ls,expdesc *v,int limit)

{
  unsigned_short *puVar1;
  int iVar2;
  BinOpr BVar3;
  BinOpr op;
  UnOpr op_00;
  expdesc v2;
  
  enterlevel(ls);
  iVar2 = (ls->t).token;
  switch(iVar2) {
  case 0x107:
    v->t = -1;
    v->f = -1;
    v->k = VFALSE;
    goto LAB_0011289c;
  case 0x108:
  case 0x10a:
  case 0x10b:
  case 0x10c:
  case 0x10d:
switchD_0011279b_caseD_108:
    suffixedexp(ls,v);
    break;
  case 0x109:
    luaX_next(ls);
    body(ls,v,0,ls->linenumber);
    break;
  case 0x10e:
    v->t = -1;
    v->f = -1;
    v->k = VNIL;
LAB_0011289c:
    (v->u).info = 0;
LAB_001128ea:
    luaX_next(ls);
    break;
  case 0x10f:
    op_00 = OPR_NOT;
LAB_001128a6:
    iVar2 = ls->linenumber;
    luaX_next(ls);
    subexpr(ls,v,0xc);
    luaK_prefix(ls->fs,op_00,v,iVar2);
    break;
  default:
    if (iVar2 == 0x23) {
      op_00 = OPR_LEN;
      goto LAB_001128a6;
    }
    if (iVar2 == 0x125) {
      codestring(ls,v,(ls->t).seminfo.ts);
    }
    else {
      if (iVar2 == 0x7b) {
        constructor(ls,v);
        break;
      }
      if (iVar2 == 0x7e) {
        op_00 = OPR_BNOT;
        goto LAB_001128a6;
      }
      if (iVar2 == 0x114) {
        v->t = -1;
        v->f = -1;
        v->k = VTRUE;
        goto LAB_0011289c;
      }
      if (iVar2 == 0x119) {
        if (ls->fs->f->is_vararg == '\0') {
          luaX_syntaxerror(ls,"cannot use \'...\' outside a vararg function");
        }
        iVar2 = luaK_codeABC(ls->fs,OP_VARARG,0,1,0);
        v->t = -1;
        v->f = -1;
        v->k = VVARARG;
        (v->u).info = iVar2;
      }
      else if (iVar2 == 0x122) {
        v->t = -1;
        v->f = -1;
        v->k = VKFLT;
        (v->u).info = 0;
        v->u = *(anon_union_8_4_e6d17769_for_u *)&(ls->t).seminfo;
      }
      else {
        if (iVar2 != 0x123) {
          if (iVar2 != 0x2d) goto switchD_0011279b_caseD_108;
          op_00 = OPR_MINUS;
          goto LAB_001128a6;
        }
        v->t = -1;
        v->f = -1;
        v->k = VKINT;
        (v->u).info = 0;
        v->u = *(anon_union_8_4_e6d17769_for_u *)&(ls->t).seminfo;
      }
    }
    goto LAB_001128ea;
  }
  iVar2 = (ls->t).token;
  switch(iVar2) {
  case 0x110:
    op = OPR_OR;
    break;
  case 0x111:
  case 0x112:
  case 0x113:
  case 0x114:
  case 0x115:
  case 0x116:
  case 0x119:
    goto switchD_0011295b_caseD_27;
  case 0x117:
    op = OPR_IDIV;
    break;
  case 0x118:
    op = OPR_CONCAT;
    break;
  case 0x11a:
    op = OPR_EQ;
    break;
  case 0x11b:
    op = OPR_GE;
    break;
  case 0x11c:
    op = OPR_LE;
    break;
  case 0x11d:
    op = OPR_NE;
    break;
  case 0x11e:
    op = OPR_SHL;
    break;
  case 0x11f:
    op = OPR_SHR;
    break;
  default:
    switch(iVar2) {
    case 0x25:
      op = OPR_MOD;
      break;
    case 0x26:
      op = OPR_BAND;
      break;
    case 0x2a:
      op = OPR_MUL;
      break;
    case 0x2b:
      op = OPR_ADD;
      break;
    case 0x2d:
      op = OPR_SUB;
      break;
    case 0x2f:
      op = OPR_DIV;
      break;
    default:
      if (iVar2 == 0x3c) {
        op = OPR_LT;
        break;
      }
      if (iVar2 == 0x3e) {
        op = OPR_GT;
        break;
      }
      if (iVar2 == 0x5e) {
        op = OPR_POW;
        break;
      }
      if (iVar2 == 0x7c) {
        op = OPR_BOR;
        break;
      }
      if (iVar2 == 0x7e) {
        op = OPR_BXOR;
        break;
      }
      if (iVar2 == 0x101) {
        op = OPR_AND;
        break;
      }
    case 0x27:
    case 0x28:
    case 0x29:
    case 0x2c:
    case 0x2e:
switchD_0011295b_caseD_27:
      op = OPR_NOBINOPR;
    }
  }
  while ((op != OPR_NOBINOPR && (limit < (int)(uint)priority[op].left))) {
    iVar2 = ls->linenumber;
    luaX_next(ls);
    luaK_infix(ls->fs,op,v);
    BVar3 = subexpr(ls,&v2,(uint)priority[op].right);
    luaK_posfix(ls->fs,op,v,&v2,iVar2);
    op = BVar3;
  }
  puVar1 = &ls->L->nCcalls;
  *puVar1 = *puVar1 - 1;
  return op;
}

Assistant:

static BinOpr subexpr(LexState *ls, expdesc *v, int limit) {
    BinOpr op;
    UnOpr uop;
    enterlevel(ls);
    uop = getunopr(ls->t.token);
    if (uop != OPR_NOUNOPR) {
        int line = ls->linenumber;
        luaX_next(ls);
        subexpr(ls, v, UNARY_PRIORITY);
        luaK_prefix(ls->fs, uop, v, line);
    } else simpleexp(ls, v);
    /* expand while operators have priorities higher than 'limit' */
    op = getbinopr(ls->t.token);
    while (op != OPR_NOBINOPR && priority[op].left > limit) {
        expdesc v2;
        BinOpr nextop;
        int line = ls->linenumber;
        luaX_next(ls);
        luaK_infix(ls->fs, op, v);
        /* read sub-expression with higher priority */
        nextop = subexpr(ls, &v2, priority[op].right);
        luaK_posfix(ls->fs, op, v, &v2, line);
        op = nextop;
    }
    leavelevel(ls);
    return op;  /* return first untreated operator */
}